

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Direct_Move_X(TT_ExecContext exc,TT_GlyphZone zone,FT_UShort point,FT_F26Dot6 distance)

{
  FT_F26Dot6 distance_local;
  FT_UShort point_local;
  TT_GlyphZone zone_local;
  TT_ExecContext exc_local;
  
  if ((*(int *)&(exc->face->root).driver[2].root.library == 0x28) &&
     (exc->backward_compatibility == '\0')) {
    zone->cur[point].x = zone->cur[point].x + distance;
  }
  else if (*(int *)&(exc->face->root).driver[2].root.library == 0x23) {
    zone->cur[point].x = zone->cur[point].x + distance;
  }
  zone->tags[point] = zone->tags[point] | 8;
  return;
}

Assistant:

static void
  Direct_Move_X( TT_ExecContext  exc,
                 TT_GlyphZone    zone,
                 FT_UShort       point,
                 FT_F26Dot6      distance )
  {
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( SUBPIXEL_HINTING_INFINALITY && !exc->ignore_x_mode )
      zone->cur[point].x = ADD_LONG( zone->cur[point].x, distance );
    else
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    if ( SUBPIXEL_HINTING_MINIMAL && !exc->backward_compatibility )
      zone->cur[point].x = ADD_LONG( zone->cur[point].x, distance );
    else
#endif

    if ( NO_SUBPIXEL_HINTING )
      zone->cur[point].x = ADD_LONG( zone->cur[point].x, distance );

    zone->tags[point]  |= FT_CURVE_TAG_TOUCH_X;
  }